

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Format::get_ids(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Format *this,
               CylHead *cylhead)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  allocator_type local_62;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_62 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->sectors,(bool *)&local_62,&local_61);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)this->sectors,&local_62);
  iVar8 = this->sectors;
  if (iVar8 < 1) {
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    iVar1 = this->base;
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = 0;
    do {
      iVar3 = cylhead->cyl * this->skew + this->interleave * iVar9 + this->offset;
      do {
        iVar6 = iVar3 % iVar8;
        uVar5 = (ulong)iVar6;
        iVar4 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar4 = iVar6;
        }
        uVar7 = (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001);
        iVar3 = iVar6 + 1;
      } while ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[(long)(iVar4 >> 6) + (uVar7 - 1)] >>
                (uVar5 & 0x3f) & 1) != 0);
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[(long)(iVar4 >> 6) + (uVar7 - 1)] =
           1L << ((byte)iVar6 & 0x3f) |
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(long)(iVar4 >> 6) + (uVar7 - 1)];
      piVar2[uVar5] = iVar9 + iVar1;
      iVar9 = iVar9 + 1;
      iVar8 = this->sectors;
    } while (iVar9 < iVar8);
  }
  local_60 = __return_storage_ptr__;
  operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                  (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage -
                  (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  return local_60;
}

Assistant:

std::vector<int> Format::get_ids(const CylHead& cylhead) const
{
    std::vector<bool> used(sectors);
    std::vector<int> ids(sectors);

    auto base_id = base;

    for (auto s = 0; s < sectors; ++s)
    {
        // Calculate the expected sector index using the interleave and skew
        auto index = (offset + s * interleave + skew * (cylhead.cyl)) % sectors;

        // Find a free slot starting from the expected position
        for (; used[index]; index = (index + 1) % sectors);
        used[index] = 1;

        // Assign the sector number, with offset adjustments
        ids[index] = base_id + s;
    }

    return ids;
}